

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O2

QModelIndex * __thiscall
QTransposeProxyModel::parent
          (QModelIndex *__return_storage_ptr__,QTransposeProxyModel *this,QModelIndex *index)

{
  QTransposeProxyModelPrivate *this_00;
  bool bVar1;
  parameter_type pQVar2;
  long in_FS_OFFSET;
  QModelIndex QStack_58;
  QModelIndex local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTransposeProxyModelPrivate **)(this + 8);
  pQVar2 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
           ::value(&(this_00->super_QAbstractProxyModelPrivate).model);
  if ((pQVar2 == (parameter_type)0x0) || (bVar1 = QModelIndex::isValid(index), !bVar1)) {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
      return __return_storage_ptr__;
    }
  }
  else {
    QTransposeProxyModelPrivate::uncheckedMapToSource(&QStack_58,this_00,index);
    QModelIndex::parent(&local_40,&QStack_58);
    QTransposeProxyModelPrivate::uncheckedMapFromSource(__return_storage_ptr__,this_00,&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QTransposeProxyModel::parent(const QModelIndex &index) const
{
    Q_D(const QTransposeProxyModel);
    Q_ASSERT(checkIndex(index, CheckIndexOption::DoNotUseParent));
    if (!d->model || !index.isValid())
        return QModelIndex();
    return d->uncheckedMapFromSource(d->uncheckedMapToSource(index).parent());
}